

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void large_dalloc_prep_impl(tsdn_t *tsdn,arena_t *arena,edata_t *edata,_Bool locked)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,locked) == 0) {
    if (duckdb_je_manual_arena_base <= arena->ind) {
      malloc_mutex_lock(tsdn,&arena->large_mtx);
      edata_list_active_remove(&arena->large,edata);
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48));
    }
  }
  else if (duckdb_je_manual_arena_base <= arena->ind) {
    edata_list_active_remove(&arena->large,edata);
  }
  duckdb_je_arena_extent_dalloc_large_prep(tsdn,arena,edata);
  return;
}

Assistant:

static void
large_dalloc_prep_impl(tsdn_t *tsdn, arena_t *arena, edata_t *edata,
    bool locked) {
	if (!locked) {
		/* See comments in arena_bin_slabs_full_insert(). */
		if (!arena_is_auto(arena)) {
			malloc_mutex_lock(tsdn, &arena->large_mtx);
			edata_list_active_remove(&arena->large, edata);
			malloc_mutex_unlock(tsdn, &arena->large_mtx);
		}
	} else {
		/* Only hold the large_mtx if necessary. */
		if (!arena_is_auto(arena)) {
			malloc_mutex_assert_owner(tsdn, &arena->large_mtx);
			edata_list_active_remove(&arena->large, edata);
		}
	}
	arena_extent_dalloc_large_prep(tsdn, arena, edata);
}